

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_planesurface.cpp
# Opt level: O0

bool __thiscall ON_ClippingPlaneSurface::Write(ON_ClippingPlaneSurface *this,ON_BinaryArchive *file)

{
  bool bVar1;
  bool local_21;
  bool rc;
  ON_BinaryArchive *file_local;
  ON_ClippingPlaneSurface *this_local;
  
  bVar1 = ON_BinaryArchive::BeginWrite3dmChunk(file,0x40008000,1,0);
  if (bVar1) {
    local_21 = ON_BinaryArchive::BeginWrite3dmChunk(file,0x40008000,0);
    if (local_21) {
      bVar1 = ON_PlaneSurface::Write(&this->super_ON_PlaneSurface,file);
      local_21 = (bool)(-bVar1 & 1);
      bVar1 = ON_BinaryArchive::EndWrite3dmChunk(file);
      if (!bVar1) {
        local_21 = false;
      }
    }
    if (local_21 != false) {
      local_21 = ON_ClippingPlane::Write(&this->m_clipping_plane,file);
    }
    bVar1 = ON_BinaryArchive::EndWrite3dmChunk(file);
    if (!bVar1) {
      local_21 = false;
    }
    this_local._7_1_ = local_21;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_ClippingPlaneSurface::Write( ON_BinaryArchive& file ) const
{
  bool rc = file.BeginWrite3dmChunk(TCODE_ANONYMOUS_CHUNK,1,0);
  if (!rc)
    return false;

  for(;;)
  {
    rc = file.BeginWrite3dmChunk(TCODE_ANONYMOUS_CHUNK,0);
    if (rc)
    {
      rc = ON_PlaneSurface::Write(file)?true:false;
      if (!file.EndWrite3dmChunk())
        rc = false;
    }
    if (!rc) break;

    rc = m_clipping_plane.Write(file);
    if (rc) break;

    break;
  }

  if (!file.EndWrite3dmChunk() )
    rc = false;

  return rc;
}